

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quad_matcher.cxx
# Opt level: O3

string * __thiscall
IntegratorXX::Matchers::WithinAbsMatcher::describe_abi_cxx11_
          (string *__return_storage_ptr__,WithinAbsMatcher *this)

{
  ostream *poVar1;
  stringstream ss;
  stringstream local_1a0 [16];
  long local_190;
  undefined8 local_188 [2];
  uint auStack_178 [22];
  ios_base local_120 [264];
  
  std::__cxx11::stringstream::stringstream(local_1a0);
  *(uint *)((long)auStack_178 + *(long *)(local_190 + -0x18)) =
       *(uint *)((long)auStack_178 + *(long *)(local_190 + -0x18)) & 0xfffffefb | 0x100;
  *(undefined8 *)((long)local_188 + *(long *)(local_190 + -0x18)) = 6;
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_190," is not within ",0xf);
  poVar1 = std::ostream::_M_insert<double>(this->m_margin);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1," of ",4);
  poVar1 = std::ostream::_M_insert<double>(this->m_target);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,"\n(",2);
  poVar1 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar1,(this->m_msg)._M_dataplus._M_p,(this->m_msg)._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,")",1);
  std::__cxx11::stringbuf::str();
  std::__cxx11::stringstream::~stringstream(local_1a0);
  std::ios_base::~ios_base(local_120);
  return __return_storage_ptr__;
}

Assistant:

std::string WithinAbsMatcher::describe() const {
        std::stringstream ss;
        ss << std::scientific;
        ss << std::setprecision(6);
        ss << " is not within " << m_margin << " of " << m_target << "\n(" << m_msg << ")";
        return ss.str();
    }